

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElfFile.cpp
# Opt level: O3

void __thiscall ElfFile::loadSectionNames(ElfFile *this)

{
  byte bVar1;
  ElfSection *pEVar2;
  pointer ppEVar3;
  ulong uVar4;
  pointer ppEVar5;
  ulong uVar6;
  ulong uVar7;
  string strName;
  allocator<char> local_51;
  long *local_50 [2];
  long local_40 [2];
  
  uVar6 = (ulong)(this->fileHeader).e_shstrndx;
  if (uVar6 != 0) {
    ppEVar3 = (this->sections).super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar4 = (ulong)(ppEVar3[uVar6]->header).sh_size;
    if (uVar4 != 0) {
      uVar7 = 0;
      do {
        bVar1 = (this->fileData).data_[uVar7 + (ppEVar3[uVar6]->header).sh_offset];
        if (bVar1 != '\0' && (char)bVar1 < ' ') {
          return;
        }
        uVar7 = uVar7 + 1;
      } while (uVar4 != uVar7);
    }
    ppEVar5 = (this->sections).super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppEVar5 != ppEVar3) {
      uVar6 = 0;
      do {
        pEVar2 = ppEVar3[uVar6];
        if ((pEVar2->header).sh_type != 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_50,
                     (char *)((this->fileData).data_ +
                             (int)((pEVar2->header).sh_name +
                                  (ppEVar3[(this->fileHeader).e_shstrndx]->header).sh_offset)),
                     &local_51);
          std::__cxx11::string::_M_assign((string *)&pEVar2->name);
          if (local_50[0] != local_40) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
          ppEVar3 = (this->sections).super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppEVar5 = (this->sections).super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < (ulong)((long)ppEVar5 - (long)ppEVar3 >> 3));
    }
  }
  return;
}

Assistant:

void ElfFile::loadSectionNames()
{
	if (fileHeader.e_shstrndx == SHN_UNDEF) return;

	// check if the string table is actually a string table
	// sometimes it gives the wrong section id
	size_t strTablePos = sections[fileHeader.e_shstrndx]->getOffset();
	size_t strTableSize = sections[fileHeader.e_shstrndx]->getSize();
	for (size_t i = 0; i < strTableSize; i++)
	{
		if (fileData[strTablePos+i] != 0 && fileData[strTablePos+i] < 0x20)
			return;
		if (fileData[strTablePos+i] > 0x7F)
			return;
	}

	for (size_t i = 0; i < sections.size(); i++)
	{
		ElfSection* section = sections[i];
		if (section->getType() == SHT_NULL) continue;

		int strTablePos = sections[fileHeader.e_shstrndx]->getOffset();
		int offset = strTablePos+section->getNameOffset();

		char* name = (char*) fileData.data(offset);
		std::string strName = name;
		section->setName(strName);
	}
}